

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void mips_tr_init_disas_context(DisasContextBase *dcbase,CPUState *cs)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  undefined8 uVar5;
  byte bVar6;
  undefined4 uVar7;
  uint uVar8;
  byte bVar9;
  
  pvVar3 = cs->env_ptr;
  dcbase[4].pc_first = (target_ulong)cs->uc;
  dcbase[1].pc_first = dcbase->pc_first & 0xfffffffffffff000;
  dcbase[1].tb = (TranslationBlock *)0xffffffffffffffff;
  uVar4 = *(ulong *)((long)pvVar3 + 0x3e68);
  dcbase[1].is_jmp = (int)uVar4;
  dcbase[1].num_insns = (int)(uVar4 >> 0x20);
  dcbase[1].max_insns = *(int *)((long)pvVar3 + 0x6cc);
  *(undefined4 *)&dcbase[1].singlestep_enabled = *(undefined4 *)((long)pvVar3 + 0x6d0);
  uVar8 = *(uint *)((long)pvVar3 + 0x6d4);
  *(uint *)&dcbase[2].tb = uVar8;
  uVar1 = *(uint *)((long)pvVar3 + 0x6e0);
  *(uint *)((long)&dcbase[2].tb + 4) = uVar1;
  dcbase[2].is_jmp = DISAS_NEXT;
  dcbase[2].num_insns = 0;
  uVar2 = *(uint *)((long)pvVar3 + 0x6d8);
  *(uint *)&dcbase[2].singlestep_enabled = uVar2 >> 0x10 & 0xff;
  *(byte *)&dcbase[3].tb = (byte)(uVar8 >> 0xc) & 1;
  *(uint *)((long)&dcbase[3].tb + 4) = uVar2 >> 0x1d & 3;
  bVar6 = (byte)(uVar8 >> 0x18);
  *(byte *)&dcbase[3].pc_first = bVar6 >> 2 & 1;
  *(byte *)((long)&dcbase[3].pc_first + 1) = bVar6 >> 3 & 1;
  dcbase[3].pc_next = *(target_ulong *)((long)pvVar3 + 0x568);
  bVar9 = (byte)uVar1;
  *(undefined1 *)&dcbase[3].is_jmp = bVar9 >> 5 & DISAS_TOO_MANY;
  *(byte *)((long)&dcbase[3].is_jmp + 1) = (byte)(uVar1 >> 0x1c) & 1;
  *(byte *)((long)&dcbase[3].is_jmp + 2) = bVar6 >> 1 & 1;
  dcbase[3].num_insns = *(int *)((long)pvVar3 + 0x7a8);
  *(byte *)((long)&dcbase[3].max_insns + 2) = bVar6 >> 5 & 1;
  uVar2 = dcbase->tb->flags;
  *(uint *)&dcbase[2].pc_next = uVar2;
  *(byte *)&dcbase[2].max_insns = (byte)(uVar8 >> 0xd) & 1;
  *(byte *)&dcbase[3].max_insns =
       (uVar4 & 0x3000000000000) != 0 | (byte)(*(uint *)((long)pvVar3 + 0x540) >> 0x12) & 1;
  *(byte *)((long)&dcbase[3].max_insns + 1) = bVar9 >> 7;
  *(byte *)((long)&dcbase[3].max_insns + 3) = bVar9 >> 3 & 1;
  uVar8 = *(uint *)((long)pvVar3 + 0x548);
  dcbase[3].singlestep_enabled = (_Bool)((byte)(uVar8 >> 0x12) & 1);
  dcbase[3].field_0x25 = (byte)(uVar8 >> 0x13) & 1;
  dcbase[3].field_0x27 = (byte)(uVar1 >> 0x11) & 1;
  *(uint *)&dcbase[4].tb = uVar1 >> 0xf & 3;
  *(uint *)((long)&dcbase[2].pc_next + 4) = uVar2;
  uVar8 = uVar2 & 0x803800;
  if (((uVar8 == 0x800) || (uVar8 == 0x1800)) || (uVar8 == 0x1000)) {
    uVar5 = *(undefined8 *)((long)pvVar3 + 0x3e48);
    dcbase[2].is_jmp = (int)uVar5;
    dcbase[2].num_insns = (int)((ulong)uVar5 >> 0x20);
  }
  uVar8 = 3;
  if ((uVar2 >> 0x1c & 1) == 0) {
    uVar8 = uVar2 & 3;
  }
  *(uint *)&dcbase[2].pc_first = uVar8;
  uVar7 = 0x70;
  if (((uint)uVar4 >> 0xd & 1) == 0) {
    uVar7 = 0;
  }
  *(undefined4 *)((long)&dcbase[2].pc_first + 4) = uVar7;
  return;
}

Assistant:

static void mips_tr_init_disas_context(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    CPUMIPSState *env = cs->env_ptr;

    // unicorn setup
    ctx->uc = cs->uc;

    ctx->page_start = ctx->base.pc_first & TARGET_PAGE_MASK;
    ctx->saved_pc = -1;
    ctx->insn_flags = env->insn_flags;
    ctx->CP0_Config1 = env->CP0_Config1;
    ctx->CP0_Config2 = env->CP0_Config2;
    ctx->CP0_Config3 = env->CP0_Config3;
    ctx->CP0_Config5 = env->CP0_Config5;
    ctx->btarget = 0;
    ctx->kscrexist = (env->CP0_Config4 >> CP0C4_KScrExist) & 0xff;
    ctx->rxi = (env->CP0_Config3 >> CP0C3_RXI) & 1;
    ctx->ie = (env->CP0_Config4 >> CP0C4_IE) & 3;
    ctx->bi = (env->CP0_Config3 >> CP0C3_BI) & 1;
    ctx->bp = (env->CP0_Config3 >> CP0C3_BP) & 1;
    ctx->PAMask = env->PAMask;
    ctx->mvh = (env->CP0_Config5 >> CP0C5_MVH) & 1;
    ctx->eva = (env->CP0_Config5 >> CP0C5_EVA) & 1;
    ctx->sc = (env->CP0_Config3 >> CP0C3_SC) & 1;
    ctx->CP0_LLAddr_shift = env->CP0_LLAddr_shift;
    ctx->cmgcr = (env->CP0_Config3 >> CP0C3_CMGCR) & 1;
    /* Restore delay slot state from the tb context.  */
    ctx->hflags = (uint32_t)ctx->base.tb->flags; /* FIXME: maybe use 64 bits? */
    ctx->ulri = (env->CP0_Config3 >> CP0C3_ULRI) & 1;
    ctx->ps = ((env->active_fpu.fcr0 >> FCR0_PS) & 1) ||
             (env->insn_flags & (INSN_LOONGSON2E | INSN_LOONGSON2F));
    ctx->vp = (env->CP0_Config5 >> CP0C5_VP) & 1;
    ctx->mrp = (env->CP0_Config5 >> CP0C5_MRP) & 1;
    ctx->nan2008 = (env->active_fpu.fcr31 >> FCR31_NAN2008) & 1;
    ctx->abs2008 = (env->active_fpu.fcr31 >> FCR31_ABS2008) & 1;
    ctx->mi = (env->CP0_Config5 >> CP0C5_MI) & 1;
    ctx->gi = (env->CP0_Config5 >> CP0C5_GI) & 3;
    restore_cpu_state(env, ctx);
    ctx->mem_idx = hflags_mmu_index(ctx->hflags);
    ctx->default_tcg_memop_mask = (ctx->insn_flags & ISA_MIPS32R6) ?
                                  MO_UNALN : MO_ALIGN;

    LOG_DISAS("\ntb %p idx %d hflags %04x\n", ctx->base.tb, ctx->mem_idx,
              ctx->hflags);
}